

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O3

int main(void)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  size_t i;
  long lVar4;
  long lVar5;
  long lVar6;
  array<unsigned_long,_26UL> histogram;
  long local_e8 [26];
  
  memset(local_e8,0,0xd0);
  sVar2 = 0;
  do {
    cVar1 = anon_var_dwarf_4b1[sVar2];
    iVar3 = -0x61;
    if (((byte)(cVar1 + 0x9fU) < 0x1a) || (iVar3 = -0x41, (byte)(cVar1 + 0xbfU) < 0x1a)) {
      local_e8[(uint)(iVar3 + cVar1)] = local_e8[(uint)(iVar3 + cVar1)] + 1;
    }
    sVar2 = sVar2 + 1;
  } while (sVar2 != 0x4f92e);
  puts("Characters in \'On Liberty\':");
  lVar4 = 0;
  do {
    printf("%c: %zu\n",(ulong)((int)lVar4 + 0x61),local_e8[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x1a);
  lVar5 = 0;
  lVar6 = 0;
  lVar4 = 0;
  do {
    lVar5 = lVar5 + local_e8[lVar4];
    lVar6 = lVar6 + local_e8[lVar4 + 1];
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0x1a);
  printf("other: %zu\n",0x4f92e - (lVar6 + lVar5));
  return 0;
}

Assistant:

int main() {
  std::array<size_t, 26> histogram = {};
  size_t length = k_books_on_liberty_txt_len;
  for (size_t i = 0; i < length; ++i) {
    char c = k_books_on_liberty_txt[i];
    if ('a' <= c && c <= 'z') {
      histogram[c-'a']++;
    } else if ('A' <= c && c <= 'Z') {
      histogram[c-'A']++;
    }
  }
  printf("Characters in 'On Liberty':\n");
  for (size_t i = 0; i < 26; ++i) {
    printf("%c: %zu\n", char('a'+i), histogram[i]);
  }
  size_t count = std::accumulate(histogram.cbegin(), histogram.cend(), size_t());
  printf("other: %zu\n", length - count);
}